

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O3

Var Js::ArrayBuffer::EntrySlice(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  JavascriptLibrary *pJVar2;
  RuntimeFunction *defaultConstructor;
  ThreadContext *this;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  Attributes attributes;
  int iVar6;
  int iVar7;
  undefined4 *puVar8;
  Var pvVar9;
  ArrayBuffer *object;
  CallInfo CVar10;
  RecyclableObject *pRVar11;
  ulong length;
  RuntimeFunction *instanceObj;
  ArrayBuffer *pAVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ScriptContext *scriptContext;
  uint uVar13;
  ulong uVar14;
  int in_stack_00000010;
  anon_class_24_3_13b32019_for_newObjectCreationFunction local_98;
  anon_class_24_3_13b32019_for_newObjectCreationFunction local_78;
  CallInfo local_60;
  CallInfo callInfo_local;
  undefined1 local_50 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x202,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b20707;
    *puVar8 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_50,&local_60);
  if (((ulong)local_50 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x204,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar4) goto LAB_00b20707;
    *puVar8 = 0;
  }
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x206,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b20707;
    *puVar8 = 0;
  }
  pvVar9 = Arguments::operator[]((Arguments *)local_50,0);
  bVar4 = VarIs<Js::ArrayBuffer>(pvVar9);
  if (!bVar4) goto LAB_00b2071f;
  pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pvVar9 = Arguments::operator[]((Arguments *)local_50,0);
  object = VarTo<Js::ArrayBuffer>(pvVar9);
  if ((object->super_ArrayBufferBase).isDetached == true) goto LAB_00b20735;
  length = (ulong)object->bufferLength;
  if (((ulong)local_50 & 0xfffffe) == 0) {
    CVar10 = (CallInfo)0x0;
LAB_00b203e0:
    callInfo_local = CVar10;
    if (0x7fffffff < (long)length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                  ,0x233,"(newLen <= MaxArrayBufferLength)",
                                  "newLen <= MaxArrayBufferLength");
      if (!bVar4) goto LAB_00b20707;
      *puVar8 = 0;
    }
  }
  else {
    pvVar9 = Arguments::operator[]((Arguments *)local_50,1);
    CVar10 = (CallInfo)JavascriptArray::GetIndexFromVar(pvVar9,length,scriptContext);
    if ((2 < (local_50._0_4_ & 0xffffff)) &&
       (pRVar11 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_50,2),
       pRVar11 != (pJVar2->super_JavascriptLibraryBase).undefinedValue.ptr)) {
      pvVar9 = Arguments::operator[]((Arguments *)local_50,2);
      length = JavascriptArray::GetIndexFromVar(pvVar9,length,scriptContext);
    }
    uVar14 = length - (long)CVar10;
    bVar4 = (long)CVar10 <= (long)length;
    length = uVar14;
    if (uVar14 != 0 && bVar4) goto LAB_00b203e0;
    length = 0;
    callInfo_local = CVar10;
  }
  uVar13 = (uint)length;
  defaultConstructor =
       (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       arrayBufferConstructor.ptr;
  instanceObj = (RuntimeFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)object,&defaultConstructor->super_JavascriptFunction,
                           scriptContext);
  bVar4 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x23a,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar4) goto LAB_00b20707;
    *puVar8 = 0;
  }
  this = scriptContext->threadContext;
  local_78.constructor = (RecyclableObject *)instanceObj;
  local_78.byteLength = uVar13;
  local_78.scriptContext = scriptContext;
  args.super_Arguments.Values = (Type)scriptContext;
  if (instanceObj == defaultConstructor) {
    bVar4 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    pRVar11 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_13b32019_for_newObjectCreationFunction::operator()(&local_78);
    this->reentrancySafeOrHandled = bVar4;
  }
  else {
    local_98._12_4_ = local_78._12_4_;
    bVar4 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    local_98.constructor = (RecyclableObject *)instanceObj;
    local_98.byteLength = uVar13;
    local_98.scriptContext = scriptContext;
    attributes = FunctionInfo::GetAttributes((RecyclableObject *)instanceObj);
    bVar5 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)instanceObj,attributes);
    if (bVar5) {
      pRVar11 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_13b32019_for_newObjectCreationFunction::operator()(&local_98);
      bVar5 = ThreadContext::IsOnStack(pRVar11);
LAB_00b2055c:
      if (bVar5 != false) {
        this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      }
    }
    else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      if ((attributes & HasNoSideEffect) != None) {
        pRVar11 = (RecyclableObject *)
                  anon_func::anon_class_24_1_2f014396::
                  anon_class_24_3_13b32019_for_newObjectCreationFunction::operator()(&local_98);
        bVar5 = ThreadContext::IsOnStack(pRVar11);
        goto LAB_00b2055c;
      }
      IVar1 = this->implicitCallFlags;
      pRVar11 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_13b32019_for_newObjectCreationFunction::operator()(&local_98);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    }
    else {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar11 = (((((((((instanceObj->super_JavascriptFunction).super_DynamicObject.
                        super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                    super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                 javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    this->reentrancySafeOrHandled = bVar4;
  }
  bVar4 = VarIs<Js::ArrayBuffer>(pRVar11);
  scriptContext = (ScriptContext *)args.super_Arguments.Values;
  if (!bVar4) {
LAB_00b2071f:
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea1c,(PCWSTR)0x0);
  }
  pAVar12 = VarTo<Js::ArrayBuffer>(pRVar11);
  scriptContext = (ScriptContext *)args.super_Arguments.Values;
  if ((pAVar12->super_ArrayBufferBase).isDetached != true) {
    if (pAVar12 == object) goto LAB_00b2071f;
    if (pAVar12->bufferLength < uVar13) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ebf6,
                 L"ArrayBuffer.prototype.slice");
    }
    if ((object->super_ArrayBufferBase).isDetached != true) {
      if (uVar13 != 0) {
        iVar6 = (*(object->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(object);
        if (CONCAT44(extraout_var,iVar6) == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                      ,0x265,"(arrayBuffer->GetBuffer() != nullptr)",
                                      "buffer must not be null when we copy from it");
          if (!bVar4) {
LAB_00b20707:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
        iVar6 = (*(pAVar12->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(pAVar12);
        iVar7 = (*(object->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(object);
        js_memcpy_s((void *)CONCAT44(extraout_var_00,iVar6),length & 0xffffffff,
                    (void *)((long)callInfo_local + CONCAT44(extraout_var_01,iVar7)),
                    length & 0xffffffff);
      }
      return pAVar12;
    }
  }
LAB_00b20735:
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,L"ArrayBuffer.prototype.slice");
}

Assistant:

Var ArrayBuffer::EntrySlice(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ScriptContext* scriptContext = function->GetScriptContext();

        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Assert(!(callInfo.Flags & CallFlags_New));

        if (!VarIs<ArrayBuffer>(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        ArrayBuffer* arrayBuffer = VarTo<ArrayBuffer>(args[0]);

        if (arrayBuffer->IsDetached()) // 24.1.4.3: 5. If IsDetachedBuffer(O) is true, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("ArrayBuffer.prototype.slice"));
        }

        int64 len = arrayBuffer->bufferLength;
        int64 start = 0, end = 0;
        int64 newLen;

        // If no start or end arguments, use the entire length
        if (args.Info.Count < 2)
        {
            newLen = len;
        }
        else
        {
            start = JavascriptArray::GetIndexFromVar(args[1], len, scriptContext);

            // If no end argument, use length as the end
            if (args.Info.Count < 3 || args[2] == library->GetUndefined())
            {
                end = len;
            }
            else
            {
                end = JavascriptArray::GetIndexFromVar(args[2], len, scriptContext);
            }

            newLen = end > start ? end - start : 0;
        }

        // We can't have allocated an ArrayBuffer with byteLength > MaxArrayBufferLength.
        // start and end are clamped to valid indices, so the new length also cannot exceed MaxArrayBufferLength.
        // Therefore, should be safe to cast down newLen to uint32.
        // TODO: If we ever support allocating ArrayBuffer with byteLength > MaxArrayBufferLength we may need to review this math.
        Assert(newLen <= MaxArrayBufferLength);
        uint32 byteLength = static_cast<uint32>(newLen);

        ArrayBuffer* newBuffer = nullptr;

        JavascriptFunction* defaultConstructor = scriptContext->GetLibrary()->GetArrayBufferConstructor();
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(arrayBuffer, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        Js::Var newVar = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
        {
            Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(byteLength, scriptContext) };
            Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
            return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext);
        });

        if (!VarIs<ArrayBuffer>(newVar)) // 24.1.4.3: 19.If new does not have an [[ArrayBufferData]] internal slot throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }

        newBuffer = VarTo<ArrayBuffer>(newVar);

        if (newBuffer->IsDetached()) // 24.1.4.3: 21. If IsDetachedBuffer(new) is true, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("ArrayBuffer.prototype.slice"));
        }

        if (newBuffer == arrayBuffer) // 24.1.4.3: 22. If SameValue(new, O) is true, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }

        if (newBuffer->bufferLength < byteLength) // 24.1.4.3: 23.If the value of new's [[ArrayBufferByteLength]] internal slot < newLen, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ArgumentOutOfRange, _u("ArrayBuffer.prototype.slice"));
        }

        Assert(newBuffer);
        Assert(newBuffer->bufferLength >= byteLength);

        if (arrayBuffer->IsDetached()) // 24.1.4.3: 24. NOTE: Side-effects of the above steps may have detached O. 25. If IsDetachedBuffer(O) is true, then throw a TypeError exception.
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("ArrayBuffer.prototype.slice"));
        }

        // Don't bother doing memcpy if we aren't copying any elements
        if (byteLength > 0)
        {
            AssertMsg(arrayBuffer->GetBuffer() != nullptr, "buffer must not be null when we copy from it");

            js_memcpy_s(newBuffer->GetBuffer(), byteLength, arrayBuffer->GetBuffer() + start, byteLength);
        }

        return newBuffer;
    }